

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_string_class.cpp
# Opt level: O0

void string_constructors(void)

{
  ostream *poVar1;
  undefined1 *puVar2;
  char *__beg;
  char *__end;
  string local_1a8 [8];
  string seven;
  string local_180 [8];
  string six1;
  string local_158 [8];
  string six;
  string local_130 [8];
  string five1;
  string local_108 [8];
  string five;
  char list [22];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [8];
  string four;
  string three;
  undefined1 local_60 [8];
  string two;
  allocator local_29;
  string local_28 [8];
  string one;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Lottery winner!",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  poVar1 = std::operator<<((ostream *)&std::cout,local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_60,0x14,'$',(allocator *)(three.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(three.field_2._M_local_buf + 0xf));
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)(four.field_2._M_local_buf + 8),local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(four.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator+=(local_28," Oops!");
  poVar1 = std::operator<<((ostream *)&std::cout,local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=((string *)local_60,"That is too bad...");
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)((long)&four.field_2 + 8));
  *puVar2 = 0x24;
  std::__cxx11::string::string(local_a8);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&four.field_2 + 8));
  std::__cxx11::string::operator=(local_a8,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar1 = std::operator<<((ostream *)&std::cout,local_a8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  five.field_2._8_1_ = 'A';
  five.field_2._9_1_ = 'l';
  five.field_2._10_1_ = 'l';
  five.field_2._11_1_ = ' ';
  five.field_2._12_1_ = 'I';
  five.field_2._13_1_ = ' ';
  five.field_2._14_1_ = 'n';
  five.field_2._15_1_ = 'e';
  builtin_strncpy(list,"ed is rest...",0xe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,five.field_2._M_local_buf + 8,0x14,
             (allocator *)(five1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(five1.field_2._M_local_buf + 0xf));
  poVar1 = std::operator<<((ostream *)&std::cout,local_108);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,five.field_2._M_local_buf + 8,5,(allocator *)(six.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(six.field_2._M_local_buf + 0xf));
  poVar1 = std::operator<<((ostream *)&std::cout,local_130);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>
            (local_158,five.field_2._M_local_buf + 0xe,list + 2,
             (allocator<char> *)(six1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(six1.field_2._M_local_buf + 0xf));
  poVar1 = std::operator<<((ostream *)&std::cout,local_158);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  __beg = (char *)std::__cxx11::string::operator[]((ulong)local_108);
  __end = (char *)std::__cxx11::string::operator[]((ulong)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>
            (local_180,__beg,__end,(allocator<char> *)(seven.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(seven.field_2._M_local_buf + 0xf));
  poVar1 = std::operator<<((ostream *)&std::cout,local_180);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_1a8,local_a8,7,0x10);
  poVar1 = std::operator<<((ostream *)&std::cout,local_1a8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)(four.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void string_constructors() {
    using namespace std;

    // 1
    string one("Lottery winner!");

    //  has already some operator overloading...
    cout << one << endl;

    // 2. similar to Array(n).fill('x').join(''), lol
    string two(20, '$');
    cout << two << endl;

    // 3. copy constructor
    string three(one);
    cout << three << endl;

    one += " Oops!";
    cout << one << endl;

    two = "That is too bad...";
    three[0] = '$';

    // 4
    string four;
    four = two + three;
    cout << four << endl;

    //  5. similar to str = string.substr(0, n)
    //  for array, it is actually addresses...
    char list[] = "All I need is rest...";
    string five(list, 20);
    cout << five << endl;

    string five1(list, 5);
    cout << five1 << endl;

    // 6. similar to str = string.substr(a, b)
    string six(list + 6, list + 10);
    cout << six << endl;

    // five is string class, its operator[] is overloaded.
    string six1(&five[6], &five[10]);
    cout << six1 << endl;

    // 7. also string.substr(a, b)
    string seven(four, 7, 16);
    cout << seven << endl;
}